

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cpp
# Opt level: O0

void __thiscall Buffer_testCreateBuffer_Test::TestBody(Buffer_testCreateBuffer_Test *this)

{
  char *__dest;
  ostream *poVar1;
  void *pvVar2;
  size_t sVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __beg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> __a;
  vector<char,_std::allocator<char>_> foo;
  string w;
  size_type offset;
  string s;
  int i;
  char data [65535];
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffefd48;
  vector<char,_std::allocator<char>_> *this_00;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffefd68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffefd70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffefd78;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffefd80;
  undefined1 auStack_101b1 [9];
  char *pcStack_101a8;
  string asStack_101a0 [32];
  vector<char,_std::allocator<char>_> *pvStack_10180;
  char *pcStack_10178;
  undefined8 uStack_10170;
  undefined8 uStack_10168;
  allocator<char> aStack_10159;
  char *pcStack_10158;
  char *pcStack_10150;
  string asStack_10148 [32];
  vector<char,_std::allocator<char>_> *pvStack_10128;
  vector<char,_std::allocator<char>_> *pvStack_10120;
  undefined8 uStack_10118;
  undefined8 uStack_10110;
  allocator aStack_100e9;
  string asStack_100e8 [39];
  allocator aStack_100c1;
  string asStack_100c0 [39];
  allocator aStack_10099;
  string asStack_10098 [39];
  allocator aStack_10071;
  string asStack_10070 [32];
  long lStack_10050;
  allocator aStack_10031;
  string asStack_10030 [36];
  int iStack_1000c;
  char acStack_10008 [65544];
  
  for (iStack_1000c = 0; iStack_1000c < 5; iStack_1000c = iStack_1000c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,acStack_10008[iStack_1000c]);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10030,"hello",&aStack_10031);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_10031);
  pvVar2 = (void *)std::__cxx11::string::c_str();
  sVar3 = std::__cxx11::string::size();
  memcpy(acStack_10008,pvVar2,sVar3);
  lStack_10050 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10070,acStack_10008,&aStack_10071);
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_10070);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(asStack_10070);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_10071);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,0xffff);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  uVar4 = std::__cxx11::string::size();
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,uVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10098," world",&aStack_10099);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_10099);
  __dest = acStack_10008 + lStack_10050;
  pvVar2 = (void *)std::__cxx11::string::c_str();
  sVar3 = std::__cxx11::string::size();
  memcpy(__dest,pvVar2,sVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_100c0,acStack_10008,&aStack_100c1);
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_100c0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(asStack_100c0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_100c1);
  memset(acStack_10008,0,0xffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_100e8,acStack_10008,&aStack_100e9);
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_100e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(asStack_100e8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_100e9);
  poVar1 = std::operator<<((ostream *)&std::cout,"done");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x13aaf3);
  uStack_10110 = std::__cxx11::string::begin();
  uStack_10118 = std::__cxx11::string::end();
  pvStack_10120 =
       (vector<char,_std::allocator<char>_> *)
       std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffefd48);
  pvStack_10128 =
       (vector<char,_std::allocator<char>_> *)
       std::
       copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )in_stack_fffffffffffefd78._M_current,in_stack_fffffffffffefd70,
                  in_stack_fffffffffffefd68);
  pcStack_10150 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffefd48)
  ;
  pcStack_10158 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffefd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffefd70._M_current,in_stack_fffffffffffefd80,
             in_stack_fffffffffffefd78,(allocator<char> *)in_stack_fffffffffffefd68.container);
  __beg._M_current = (char *)std::operator<<((ostream *)&std::cout,asStack_10148);
  std::ostream::operator<<(__beg._M_current,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(asStack_10148);
  std::allocator<char>::~allocator(&aStack_10159);
  __last._M_current = (char *)asStack_10098;
  uStack_10168 = std::__cxx11::string::begin();
  uStack_10170 = std::__cxx11::string::end();
  __first._M_current =
       (char *)std::back_inserter<std::vector<char,std::allocator<char>>>(in_stack_fffffffffffefd48)
  ;
  pcStack_10178 = __first._M_current;
  __a = std::
        copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  (__first,__last,in_stack_fffffffffffefd68);
  pvStack_10180 = (vector<char,_std::allocator<char>_> *)__a;
  pcStack_101a8 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffefd48)
  ;
  auStack_101b1._1_8_ = std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffefd48);
  this_00 = (vector<char,_std::allocator<char>_> *)auStack_101b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__last._M_current,
             __beg,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                   __first._M_current,(allocator<char> *)__a.container);
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_101a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(asStack_101a0);
  std::allocator<char>::~allocator((allocator<char> *)auStack_101b1);
  std::vector<char,_std::allocator<char>_>::~vector(this_00);
  std::__cxx11::string::~string(asStack_10098);
  std::__cxx11::string::~string(asStack_10030);
  return;
}

Assistant:

TEST(Buffer, testCreateBuffer) {
    char data[65535];
    for (int i=0; i<5; i++) {
        std::cout << data[i] << std::endl;
    };
    std::string s("hello");
    memcpy(&data, s.c_str(), s.size());
    auto offset = s.size();
    std::cout << std::string(data) << std::endl;
    std::cout << sizeof(data) << std::endl;
    std::cout << s.size() << std::endl;

    std::string w(" world");
    memcpy(&data[offset], w.c_str(), w.size());
    std::cout << std::string(data) << std::endl;
    memset(data, 0, 65535);
    std::cout << std::string(data) << std::endl;
    std::cout << "done" << std::endl;

    std::vector<char> foo;
    std::copy(s.begin(), s.end(), std::back_inserter(foo));

    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

    std::copy(w.begin(), w.end(), std::back_inserter(foo));
    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

}